

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

Bool CanApplyBlockStyle(Node *node)

{
  uint uVar1;
  TidyTagId TVar2;
  Bool BVar3;
  
  BVar3 = prvTidynodeHasCM(node,0xe8);
  if (BVar3 != no) {
    if (node == (Node *)0x0) {
      return yes;
    }
    if (node->tag == (Dict *)0x0) {
      return yes;
    }
    TVar2 = node->tag->id;
    uVar1 = TVar2 - TidyTag_LI;
    if (((0x36 < uVar1) || ((0x40400000080001U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
       (TVar2 != TidyTag_DIV)) {
      return yes;
    }
  }
  return no;
}

Assistant:

static Bool CanApplyBlockStyle( Node *node )
{
    if (TY_(nodeHasCM)(node,CM_BLOCK | CM_LIST | CM_DEFLIST | CM_TABLE)
        && !nodeIsDIV(node) && !nodeIsP(node)
        && !nodeIsTABLE(node) && !nodeIsTR(node) && !nodeIsLI(node) )
    {
        return yes;
    }
    return no;
}